

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O3

bool __thiscall LiteScript::Memory::SaveVariable(Memory *this,ostream *stream,uint i)

{
  _BasicMemory_1 *p_Var1;
  bool bVar2;
  Object *pOVar3;
  OStreamer *this_00;
  Type *pTVar4;
  OStreamer streamer;
  Variable v;
  OStreamer local_60;
  uint local_54;
  Variable local_50;
  Nullable<LiteScript::Variable> local_40;
  
  p_Var1 = (_BasicMemory_1 *)(this->arr)._M_elems[i >> 0x10];
  if (p_Var1 != (_BasicMemory_1 *)0x0) {
    local_60.stream = stream;
    local_54 = i;
    bVar2 = _BasicMemory_1::FlagsProtect(p_Var1,i & 0xffff);
    if (bVar2) {
      local_40.data._0_4_ = local_40.data._0_4_ & 0xffffff00;
      std::__ostream_insert<char,std::char_traits<char>>(stream,local_40.data,1);
      OStreamer::operator<<(&local_60,&local_54);
      return true;
    }
    p_Var1 = (_BasicMemory_1 *)(this->arr)._M_elems[i >> 0x10];
    if (p_Var1 == (_BasicMemory_1 *)0x0) {
      local_40.isNull = &local_40.is_null;
      local_40.is_null = true;
    }
    else {
      _BasicMemory_1::GetVariable(&local_40,p_Var1,i & 0xffff);
    }
    Variable::Variable(&local_50,(Variable *)&local_40);
    if (local_40.is_null == false) {
      Variable::~Variable((Variable *)&local_40);
    }
    local_40.data[0] = '\x01';
    std::__ostream_insert<char,std::char_traits<char>>(local_60.stream,local_40.data,1);
    pOVar3 = Variable::operator->(&local_50);
    this_00 = OStreamer::operator<<(&local_60,&pOVar3->ID);
    pOVar3 = Variable::operator->(&local_50);
    pTVar4 = Object::GetType(pOVar3);
    local_40.data._0_4_ = Type::GetID(pTVar4);
    OStreamer::operator<<(this_00,(uint *)&local_40);
    pOVar3 = Variable::operator->(&local_50);
    pTVar4 = Object::GetType(pOVar3);
    pOVar3 = Variable::operator*(&local_50);
    (*pTVar4->_vptr_Type[0x26])(pTVar4,stream,pOVar3,SaveVariable,0);
    Variable::~Variable(&local_50);
  }
  return false;
}

Assistant:

bool LiteScript::Memory::SaveVariable(std::ostream &stream, unsigned int i) {
    OStreamer streamer(stream);
    unsigned int block = i >> 16;
    if (this->arr[block] != nullptr) {
        if (((LiteScript::_BasicMemory_1 *) (this->arr[block]))->FlagsProtect(i & 0xffff)) {
            streamer << (unsigned char)0 << i;
            return true;
        }
        else {
            Variable v = *this->GetVariable(i);
            streamer << (unsigned char)1 << v->ID << v->GetType().GetID();
            v->GetType().Save(stream, *v, &Memory::SaveVariable);
            return false;
        }
    }
    return false;
}